

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

int * __thiscall btHullTriangle::neib(btHullTriangle *this,int a,int b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = -1;
  while( true ) {
    if (lVar3 == 2) {
      return &neib::er;
    }
    uVar4 = (int)lVar3 + 2;
    if (lVar3 == 1) {
      uVar4 = 0;
    }
    iVar1 = (&(this->super_int3).y)[lVar3];
    if (((iVar1 == a) && ((&(this->super_int3).x)[uVar4] == b)) ||
       ((iVar1 == b && ((&(this->super_int3).x)[uVar4] == a)))) break;
    lVar3 = lVar3 + 1;
  }
  lVar2 = 2;
  if (lVar3 != -1) {
    lVar2 = lVar3;
  }
  return &(this->n).x + lVar2;
}

Assistant:

int &btHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	btAssert(0);
	return er;
}